

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_configure(App *this)

{
  bool bVar1;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  ulong uVar3;
  App_p *app;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2;
  App *this_local;
  
  if (this->default_startup == enabled) {
    this->disabled_ = false;
  }
  else if (this->default_startup == disabled) {
    this->disabled_ = true;
  }
  __end2 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
           begin(&this->subcommands_);
  app = (App_p *)std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ::end(&this->subcommands_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                     *)&app), bVar1) {
    this_00 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
              ::operator*(&__end2);
    peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    if ((peVar2->has_automatic_name_ & 1U) != 0) {
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (this_00);
      ::std::__cxx11::string::clear();
    }
    std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (this_00);
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      peVar2->fallthrough_ = false;
      peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      peVar2->prefix_command_ = false;
    }
    peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    peVar2->parent_ = this;
    peVar2 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    _configure(peVar2);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void _configure() {
        if(default_startup == startup_mode::enabled) {
            disabled_ = false;
        } else if(default_startup == startup_mode::disabled) {
            disabled_ = true;
        }
        for(const App_p &app : subcommands_) {
            if(app->has_automatic_name_) {
                app->name_.clear();
            }
            if(app->name_.empty()) {
                app->fallthrough_ = false;  // make sure fallthrough_ is false to prevent infinite loop
                app->prefix_command_ = false;
            }
            // make sure the parent is set to be this object in preparation for parse
            app->parent_ = this;
            app->_configure();
        }
    }